

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_wallmarks.cxx
# Opt level: O1

void __thiscall write_slot::operator()(write_slot *this,wm_slot_le *slot,xr_writer *w)

{
  pointer pwVar1;
  undefined4 in_EAX;
  pointer wm;
  undefined4 uStack_28;
  int local_24;
  
  _uStack_28 = CONCAT44((int)((ulong)((long)(slot->wallmarks).
                                            super__Vector_base<xray_re::wm_object,_std::allocator<xray_re::wm_object>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(slot->wallmarks).
                                           super__Vector_base<xray_re::wm_object,_std::allocator<xray_re::wm_object>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                        -0x33333333,in_EAX);
  (*w->_vptr_xr_writer[2])(w,&local_24,4);
  xray_re::xr_writer::w_sz(w,&slot->shader);
  xray_re::xr_writer::w_sz(w,&slot->texture);
  wm = (slot->wallmarks).super__Vector_base<xray_re::wm_object,_std::allocator<xray_re::wm_object>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pwVar1 = (slot->wallmarks).
           super__Vector_base<xray_re::wm_object,_std::allocator<xray_re::wm_object>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (wm != pwVar1) {
    do {
      write_wallmark::operator()((write_wallmark *)((long)&uStack_28 + 3),wm,w);
      wm = wm + 1;
    } while (wm != pwVar1);
  }
  return;
}

Assistant:

void operator()(const wm_slot_le* slot, xr_writer& w) const {
	w.w_size_u32(slot->wallmarks.size());
	w.w_sz(slot->shader);
	w.w_sz(slot->texture);
	w.w_seq(slot->wallmarks, write_wallmark());
}